

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_ops.cc
# Opt level: O2

void google::protobuf::internal::ReflectionOps::Clear(Message *message)

{
  int iVar1;
  undefined4 extraout_var;
  UnknownFieldSet *this;
  int i;
  ulong uVar3;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  fields;
  _Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  local_38;
  long *plVar2;
  
  iVar1 = (*(message->super_MessageLite)._vptr_MessageLite[0x12])();
  plVar2 = (long *)CONCAT44(extraout_var,iVar1);
  local_38._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_38._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (**(code **)(*plVar2 + 0x60))(plVar2,message);
  uVar3 = 0;
  while( true ) {
    if ((ulong)((long)local_38._M_impl.super__Vector_impl_data._M_finish -
                (long)local_38._M_impl.super__Vector_impl_data._M_start >> 3) <= uVar3) break;
    (**(code **)(*plVar2 + 0x38))
              (plVar2,message,local_38._M_impl.super__Vector_impl_data._M_start[uVar3]);
    uVar3 = uVar3 + 1;
  }
  this = (UnknownFieldSet *)(**(code **)(*plVar2 + 0x18))(plVar2,message);
  UnknownFieldSet::Clear(this);
  std::
  _Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::~_Vector_base(&local_38);
  return;
}

Assistant:

void ReflectionOps::Clear(Message* message) {
  const Reflection* reflection = message->GetReflection();

  vector<const FieldDescriptor*> fields;
  reflection->ListFields(*message, &fields);
  for (int i = 0; i < fields.size(); i++) {
    reflection->ClearField(message, fields[i]);
  }

  reflection->MutableUnknownFields(message)->Clear();
}